

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O2

string * __thiscall
cmExtraCodeBlocksGenerator::GetCBCompilerId_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeBlocksGenerator *this,cmMakefile *mf)

{
  cmGlobalGenerator *this_00;
  bool bVar1;
  char *pcVar2;
  string compilerId;
  string systemName;
  string hostSystemName;
  string compilerIdVar;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"CMAKE_CXX_COMPILER_ID",(allocator *)&local_60);
  this_00 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  std::__cxx11::string::string((string *)&local_60,"CXX",(allocator *)&local_80);
  bVar1 = cmGlobalGenerator::GetLanguageEnabled(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&local_40);
  }
  std::__cxx11::string::string((string *)&local_80,"CMAKE_HOST_SYSTEM_NAME",(allocator *)&local_a0);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_80);
  std::__cxx11::string::string((string *)&local_60,pcVar2,&local_a2);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_a0,"CMAKE_SYSTEM_NAME",&local_a2);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_a0);
  std::__cxx11::string::string((string *)&local_80,pcVar2,&local_a1);
  std::__cxx11::string::~string((string *)&local_a0);
  pcVar2 = cmMakefile::GetSafeDefinition(mf,&local_40);
  std::__cxx11::string::string((string *)&local_a0,pcVar2,&local_a2);
  std::__cxx11::string::string((string *)__return_storage_ptr__,"gcc",&local_a2);
  bVar1 = std::operator==(&local_a0,"MSVC");
  if ((((bVar1) || (bVar1 = std::operator==(&local_a0,"Borland"), bVar1)) ||
      (bVar1 = std::operator==(&local_a0,"SDCC"), bVar1)) ||
     (((bVar1 = std::operator==(&local_a0,"Intel"), bVar1 ||
       (bVar1 = std::operator==(&local_a0,"Watcom"), bVar1)) ||
      ((bVar1 = std::operator==(&local_a0,"OpenWatcom"), bVar1 ||
       (bVar1 = std::operator==(&local_a0,"GNU"), bVar1)))))) {
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeBlocksGenerator::GetCBCompilerId(const cmMakefile* mf)
{
  // figure out which language to use
  // for now care only for C and C++
  std::string compilerIdVar = "CMAKE_CXX_COMPILER_ID";
  if (this->GlobalGenerator->GetLanguageEnabled("CXX") == false)
    {
    compilerIdVar = "CMAKE_C_COMPILER_ID";
    }

  std::string hostSystemName = mf->GetSafeDefinition("CMAKE_HOST_SYSTEM_NAME");
  std::string systemName = mf->GetSafeDefinition("CMAKE_SYSTEM_NAME");
  std::string compilerId = mf->GetSafeDefinition(compilerIdVar);
  std::string compiler = "gcc";  // default to gcc
  if (compilerId == "MSVC")
    {
    compiler = "msvc8";
    }
  else if (compilerId == "Borland")
    {
    compiler = "bcc";
    }
  else if (compilerId == "SDCC")
    {
    compiler = "sdcc";
    }
  else if (compilerId == "Intel")
    {
    compiler = "icc";
    }
  else if (compilerId == "Watcom" || compilerId == "OpenWatcom")
    {
    compiler = "ow";
    }
  else if (compilerId == "GNU")
    {
    compiler = "gcc";
    }
  return compiler;
}